

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::IsSubDirectory(string *cSubdir,string *cDir)

{
  __type _Var1;
  string subdir;
  string dir;
  string s;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (cDir->_M_string_length == 0) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)cSubdir);
    std::__cxx11::string::string((string *)&local_50,(string *)cDir);
    ConvertToUnixSlashes(&local_70);
    ConvertToUnixSlashes(&local_50);
    if ((local_50._M_string_length < local_70._M_string_length) &&
       (local_70._M_dataplus._M_p[local_50._M_string_length] == '/')) {
      std::__cxx11::string::substr((ulong)&local_30,(ulong)&local_70);
      _Var1 = std::operator==(&local_30,&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      _Var1 = false;
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return _Var1;
}

Assistant:

bool SystemTools::IsSubDirectory(const std::string& cSubdir,
                                 const std::string& cDir)
{
  if (cDir.empty()) {
    return false;
  }
  std::string subdir = cSubdir;
  std::string dir = cDir;
  SystemTools::ConvertToUnixSlashes(subdir);
  SystemTools::ConvertToUnixSlashes(dir);
  if (subdir.size() > dir.size() && subdir[dir.size()] == '/') {
    std::string s = subdir.substr(0, dir.size());
    return SystemTools::ComparePath(s, dir);
  }
  return false;
}